

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::
SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
::SmallVector(SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
              *this)

{
  unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
  *puVar1;
  SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
  *this_local;
  
  VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
  ::VectorView(&this->
                super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
              );
  this->buffer_capacity = 0;
  puVar1 = AlignedBuffer<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
           ::data(&this->stack_storage);
  (this->
  super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
  ).ptr = puVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}